

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O1

void __thiscall
google::protobuf::MapReflectionTester::ExpectMapFieldsSetViaReflectionIterator
          (MapReflectionTester *this,Message *message)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  anon_union_8_1_a8a14541_for_iterator_2 aVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  int32_t iVar18;
  uint32_t uVar19;
  FieldDescriptor *pFVar20;
  size_t sVar21;
  ctrl_t *pcVar22;
  uint64_t uVar23;
  Message *this_00;
  Reflection *this_01;
  char *pcVar24;
  slot_type sVar25;
  float fVar26;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  string_view name_25;
  string_view name_26;
  string_view name_27;
  string_view name_28;
  string_view name_29;
  string_view name_30;
  string_view name_31;
  string_view name_32;
  string_view name_33;
  string_view name_34;
  string_view name_35;
  string_view name_36;
  string_view name_37;
  string_view name_38;
  string_view name_39;
  string_view name_40;
  string_view name_41;
  string_view name_42;
  string_view name_43;
  string_view name_44;
  string_view name_45;
  string_view name_46;
  string_view name_47;
  Metadata MVar27;
  AssertionResult gtest_ar_17;
  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  map;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_29;
  array<bool,_2UL> map_11;
  int size;
  string serialized;
  string scratch;
  undefined1 local_220 [8];
  anon_union_8_1_a8a14541_for_iterator_2 local_218;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  undefined1 local_1e0 [8];
  anon_union_8_1_a8a14541_for_iterator_2 local_1d8;
  NodeBase local_1d0;
  MapFieldBase *local_1c8;
  MapKey local_1c0;
  MapValueConstRef local_1a8;
  undefined1 local_198 [8];
  anon_union_8_1_a8a14541_for_iterator_2 local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [3];
  string_view local_150;
  int local_13c;
  string local_138;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  ctrl_t *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_118 = &local_108;
  local_110 = 0;
  local_108 = 0;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  MVar27 = Message::GetMetadata(message);
  this_01 = MVar27.reflection;
  local_198._0_4_ = 2;
  name._M_str = "map_int32_int32";
  name._M_len = 0xf;
  pFVar20 = F(this,name);
  iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
  local_208.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       CONCAT44(local_208.settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_._4_4_,iVar17);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1e0,"2","reflection->FieldSize(*message, F(\"map_int32_int32\"))",
             (int *)local_198,(int *)&local_208);
  if (local_1e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if (local_1d8.slot_ == (slot_type *)0x0) {
      sVar25 = (slot_type)0x3c762c;
    }
    else {
      sVar25.value = *(value_type *)local_1d8.slot_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x56a,(char *)sVar25);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_198);
  }
  else {
    if (local_1d8.slot_ != (slot_type *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1e0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1d8.slot_);
    }
    local_198._0_4_ = 2;
    name_00._M_str = "map_int64_int64";
    name_00._M_len = 0xf;
    pFVar20 = F(this,name_00);
    iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
    local_208.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = CONCAT44(local_208.settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_._4_4_,iVar17);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_1e0,"2","reflection->FieldSize(*message, F(\"map_int64_int64\"))",
               (int *)local_198,(int *)&local_208);
    if (local_1e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_198);
      if (local_1d8.slot_ == (slot_type *)0x0) {
        sVar25 = (slot_type)0x3c762c;
      }
      else {
        sVar25.value = *(value_type *)local_1d8.slot_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_208,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                 ,0x56b,(char *)sVar25);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_198);
    }
    else {
      if (local_1d8.slot_ != (slot_type *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_1e0 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1d8.slot_);
      }
      local_198._0_4_ = 2;
      name_01._M_str = "map_uint32_uint32";
      name_01._M_len = 0x11;
      pFVar20 = F(this,name_01);
      iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
      local_208.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = CONCAT44(local_208.settings_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.capacity_._4_4_,iVar17);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_1e0,"2",
                 "reflection->FieldSize(*message, F(\"map_uint32_uint32\"))",(int *)local_198,
                 (int *)&local_208);
      if (local_1e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_198);
        if (local_1d8.slot_ == (slot_type *)0x0) {
          sVar25 = (slot_type)0x3c762c;
        }
        else {
          sVar25.value = *(value_type *)local_1d8.slot_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_208,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                   ,0x56c,(char *)sVar25);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_198);
      }
      else {
        if (local_1d8.slot_ != (slot_type *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_1e0 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8.slot_);
        }
        local_198._0_4_ = 2;
        name_02._M_str = "map_uint64_uint64";
        name_02._M_len = 0x11;
        pFVar20 = F(this,name_02);
        iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
        local_208.settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ = CONCAT44(local_208.settings_.
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                             .value.capacity_._4_4_,iVar17);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1e0,"2",
                   "reflection->FieldSize(*message, F(\"map_uint64_uint64\"))",(int *)local_198,
                   (int *)&local_208);
        if (local_1e0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_198);
          if (local_1d8.slot_ == (slot_type *)0x0) {
            sVar25 = (slot_type)0x3c762c;
          }
          else {
            sVar25.value = *(value_type *)local_1d8.slot_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_208,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                     ,0x56d,(char *)sVar25);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_208,(Message *)local_198);
        }
        else {
          if (local_1d8.slot_ != (slot_type *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_1e0 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8.slot_);
          }
          local_198._0_4_ = 2;
          name_03._M_str = "map_sint32_sint32";
          name_03._M_len = 0x11;
          pFVar20 = F(this,name_03);
          iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
          local_208.settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_ = CONCAT44(local_208.settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.capacity_._4_4_,iVar17);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_1e0,"2",
                     "reflection->FieldSize(*message, F(\"map_sint32_sint32\"))",(int *)local_198,
                     (int *)&local_208);
          if (local_1e0[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_198);
            if (local_1d8.slot_ == (slot_type *)0x0) {
              sVar25 = (slot_type)0x3c762c;
            }
            else {
              sVar25.value = *(value_type *)local_1d8.slot_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_208,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                       ,0x56e,(char *)sVar25);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_208,(Message *)local_198);
          }
          else {
            if (local_1d8.slot_ != (slot_type *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_1e0 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d8.slot_);
            }
            local_198._0_4_ = 2;
            name_04._M_str = "map_sint64_sint64";
            name_04._M_len = 0x11;
            pFVar20 = F(this,name_04);
            iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
            local_208.settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_ = CONCAT44(local_208.settings_.
                                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                 .
                                 super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                 .value.capacity_._4_4_,iVar17);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_1e0,"2",
                       "reflection->FieldSize(*message, F(\"map_sint64_sint64\"))",(int *)local_198,
                       (int *)&local_208);
            if (local_1e0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_198);
              if (local_1d8.slot_ == (slot_type *)0x0) {
                sVar25 = (slot_type)0x3c762c;
              }
              else {
                sVar25.value = *(value_type *)local_1d8.slot_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_208,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                         ,0x56f,(char *)sVar25);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_208,(Message *)local_198);
            }
            else {
              if (local_1d8.slot_ != (slot_type *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(local_1e0 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d8.slot_);
              }
              local_198._0_4_ = 2;
              name_05._M_str = "map_fixed32_fixed32";
              name_05._M_len = 0x13;
              pFVar20 = F(this,name_05);
              iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
              local_208.settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .capacity_ = CONCAT44(local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_._4_4_,iVar17);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_1e0,"2",
                         "reflection->FieldSize(*message, F(\"map_fixed32_fixed32\"))",
                         (int *)local_198,(int *)&local_208);
              if (local_1e0[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_198);
                if (local_1d8.slot_ == (slot_type *)0x0) {
                  sVar25 = (slot_type)0x3c762c;
                }
                else {
                  sVar25.value = *(value_type *)local_1d8.slot_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_208,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                           ,0x570,(char *)sVar25);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_208,(Message *)local_198);
              }
              else {
                if (local_1d8.slot_ != (slot_type *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)(local_1e0 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1d8.slot_);
                }
                local_198._0_4_ = 2;
                name_06._M_str = "map_fixed64_fixed64";
                name_06._M_len = 0x13;
                pFVar20 = F(this,name_06);
                iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
                local_208.settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_ =
                     CONCAT44(local_208.settings_.
                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                              .value.capacity_._4_4_,iVar17);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_1e0,"2",
                           "reflection->FieldSize(*message, F(\"map_fixed64_fixed64\"))",
                           (int *)local_198,(int *)&local_208);
                if (local_1e0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_198);
                  if (local_1d8.slot_ == (slot_type *)0x0) {
                    sVar25 = (slot_type)0x3c762c;
                  }
                  else {
                    sVar25.value = *(value_type *)local_1d8.slot_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_208,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                             ,0x571,(char *)sVar25);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_208,(Message *)local_198);
                }
                else {
                  if (local_1d8.slot_ != (slot_type *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)(local_1e0 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1d8.slot_);
                  }
                  local_198._0_4_ = 2;
                  name_07._M_str = "map_sfixed32_sfixed32";
                  name_07._M_len = 0x15;
                  pFVar20 = F(this,name_07);
                  iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
                  local_208.settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_ =
                       CONCAT44(local_208.settings_.
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value.capacity_._4_4_,iVar17);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_1e0,"2",
                             "reflection->FieldSize(*message, F(\"map_sfixed32_sfixed32\"))",
                             (int *)local_198,(int *)&local_208);
                  if (local_1e0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_198);
                    if (local_1d8.slot_ == (slot_type *)0x0) {
                      sVar25 = (slot_type)0x3c762c;
                    }
                    else {
                      sVar25.value = *(value_type *)local_1d8.slot_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_208,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                               ,0x572,(char *)sVar25);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_208,(Message *)local_198);
                  }
                  else {
                    if (local_1d8.slot_ != (slot_type *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)(local_1e0 + 8),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1d8.slot_);
                    }
                    local_198._0_4_ = 2;
                    name_08._M_str = "map_sfixed64_sfixed64";
                    name_08._M_len = 0x15;
                    pFVar20 = F(this,name_08);
                    iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
                    local_208.settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_ =
                         CONCAT44(local_208.settings_.
                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                  .value.capacity_._4_4_,iVar17);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_1e0,"2",
                               "reflection->FieldSize(*message, F(\"map_sfixed64_sfixed64\"))",
                               (int *)local_198,(int *)&local_208);
                    if (local_1e0[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_198);
                      if (local_1d8.slot_ == (slot_type *)0x0) {
                        sVar25 = (slot_type)0x3c762c;
                      }
                      else {
                        sVar25.value = *(value_type *)local_1d8.slot_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_208,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                 ,0x573,(char *)sVar25);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_208,(Message *)local_198);
                    }
                    else {
                      if (local_1d8.slot_ != (slot_type *)0x0) {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)(local_1e0 + 8),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1d8.slot_);
                      }
                      local_198._0_4_ = 2;
                      name_09._M_str = "map_int32_float";
                      name_09._M_len = 0xf;
                      pFVar20 = F(this,name_09);
                      iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
                      local_208.settings_.
                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                      .value.capacity_ =
                           CONCAT44(local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_._4_4_,iVar17);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)local_1e0,"2",
                                 "reflection->FieldSize(*message, F(\"map_int32_float\"))",
                                 (int *)local_198,(int *)&local_208);
                      if (local_1e0[0] == (internal)0x0) {
                        testing::Message::Message((Message *)local_198);
                        if (local_1d8.slot_ == (slot_type *)0x0) {
                          sVar25 = (slot_type)0x3c762c;
                        }
                        else {
                          sVar25.value = *(value_type *)local_1d8.slot_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_208,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                   ,0x574,(char *)sVar25);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_208,(Message *)local_198);
                      }
                      else {
                        if (local_1d8.slot_ != (slot_type *)0x0) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)(local_1e0 + 8),
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1d8.slot_);
                        }
                        local_198._0_4_ = 2;
                        name_10._M_str = "map_int32_double";
                        name_10._M_len = 0x10;
                        pFVar20 = F(this,name_10);
                        iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
                        local_208.settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_ =
                             CONCAT44(local_208.settings_.
                                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                      .
                                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                      .value.capacity_._4_4_,iVar17);
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)local_1e0,"2",
                                   "reflection->FieldSize(*message, F(\"map_int32_double\"))",
                                   (int *)local_198,(int *)&local_208);
                        if (local_1e0[0] != (internal)0x0) {
                          if (local_1d8.slot_ != (slot_type *)0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)(local_1e0 + 8),
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_1d8.slot_);
                          }
                          local_198._0_4_ = 2;
                          name_11._M_str = "map_bool_bool";
                          name_11._M_len = 0xd;
                          pFVar20 = F(this,name_11);
                          iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
                          local_208.settings_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_ =
                               CONCAT44(local_208.settings_.
                                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                        .
                                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                        .value.capacity_._4_4_,iVar17);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_1e0,"2",
                                     "reflection->FieldSize(*message, F(\"map_bool_bool\"))",
                                     (int *)local_198,(int *)&local_208);
                          if (local_1e0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)local_198);
                            if (local_1d8.slot_ == (slot_type *)0x0) {
                              sVar25 = (slot_type)0x3c762c;
                            }
                            else {
                              sVar25.value = *(value_type *)local_1d8.slot_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&local_208,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                       ,0x576,(char *)sVar25);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&local_208,(Message *)local_198);
                          }
                          else {
                            if (local_1d8.slot_ != (slot_type *)0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)(local_1e0 + 8),
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_1d8.slot_);
                            }
                            local_198._0_4_ = 2;
                            name_12._M_str = "map_string_string";
                            name_12._M_len = 0x11;
                            pFVar20 = F(this,name_12);
                            iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
                            local_208.settings_.
                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                            .value.capacity_ =
                                 CONCAT44(local_208.settings_.
                                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                          .
                                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                          .value.capacity_._4_4_,iVar17);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)local_1e0,"2",
                                       "reflection->FieldSize(*message, F(\"map_string_string\"))",
                                       (int *)local_198,(int *)&local_208);
                            if (local_1e0[0] == (internal)0x0) {
                              testing::Message::Message((Message *)local_198);
                              if (local_1d8.slot_ == (slot_type *)0x0) {
                                sVar25 = (slot_type)0x3c762c;
                              }
                              else {
                                sVar25.value = *(value_type *)local_1d8.slot_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&local_208,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                         ,0x577,(char *)sVar25);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&local_208,(Message *)local_198);
                            }
                            else {
                              if (local_1d8.slot_ != (slot_type *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)(local_1e0 + 8),
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_1d8.slot_);
                              }
                              local_198._0_4_ = 2;
                              name_13._M_str = "map_int32_bytes";
                              name_13._M_len = 0xf;
                              pFVar20 = F(this,name_13);
                              iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
                              local_208.settings_.
                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                              .value.capacity_ =
                                   CONCAT44(local_208.settings_.
                                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                            .
                                            super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                            .value.capacity_._4_4_,iVar17);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_1e0,"2",
                                         "reflection->FieldSize(*message, F(\"map_int32_bytes\"))",
                                         (int *)local_198,(int *)&local_208);
                              if (local_1e0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)local_198);
                                if (local_1d8.slot_ == (slot_type *)0x0) {
                                  sVar25 = (slot_type)0x3c762c;
                                }
                                else {
                                  sVar25.value = *(value_type *)local_1d8.slot_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&local_208,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                           ,0x578,(char *)sVar25);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&local_208,(Message *)local_198);
                              }
                              else {
                                if (local_1d8.slot_ != (slot_type *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)(local_1e0 + 8),
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_1d8.slot_);
                                }
                                local_198._0_4_ = 2;
                                name_14._M_str = "map_int32_enum";
                                name_14._M_len = 0xe;
                                pFVar20 = F(this,name_14);
                                iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
                                local_208.settings_.
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value.capacity_ =
                                     CONCAT44(local_208.settings_.
                                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                              .
                                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                              .value.capacity_._4_4_,iVar17);
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)local_1e0,"2",
                                           "reflection->FieldSize(*message, F(\"map_int32_enum\"))",
                                           (int *)local_198,(int *)&local_208);
                                if (local_1e0[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)local_198);
                                  if (local_1d8.slot_ == (slot_type *)0x0) {
                                    sVar25 = (slot_type)0x3c762c;
                                  }
                                  else {
                                    sVar25.value = *(value_type *)local_1d8.slot_;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&local_208,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                             ,0x579,(char *)sVar25);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&local_208,(Message *)local_198);
                                }
                                else {
                                  if (local_1d8.slot_ != (slot_type *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_1e0 + 8),
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1d8.slot_);
                                  }
                                  local_198._0_4_ = 2;
                                  name_15._M_str = "map_int32_foreign_message";
                                  name_15._M_len = 0x19;
                                  pFVar20 = F(this,name_15);
                                  iVar17 = Reflection::FieldSize(this_01,message,pFVar20);
                                  local_208.settings_.
                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                  .value.capacity_ =
                                       CONCAT44(local_208.settings_.
                                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                .
                                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                .value.capacity_._4_4_,iVar17);
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)local_1e0,"2",
                                             "reflection->FieldSize(*message, F(\"map_int32_foreign_message\"))"
                                             ,(int *)local_198,(int *)&local_208);
                                  if (local_1e0[0] != (internal)0x0) {
                                    if (local_1d8.slot_ != (slot_type *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_1e0 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1d8.slot_);
                                    }
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar1._12_4_ = 0;
                                    auVar1._0_12_ = stack0xfffffffffffffe6c;
                                    _local_198 = (string_view)(auVar1 << 0x20);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 0;
                                    local_198._0_4_ = 1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 1;
                                    local_13c = 0;
                                    name_16._M_str = "map_int32_int32";
                                    name_16._M_len = 0xf;
                                    pFVar20 = F(this,name_16);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_17._M_str = "map_int32_int32";
                                      name_17._M_len = 0xf;
                                      pFVar20 = F(this,name_17);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      Message::DebugString_abi_cxx11_(&local_50,message);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                                        operator_delete(local_50._M_dataplus._M_p,
                                                        local_50.field_2._M_allocated_capacity + 1);
                                      }
                                      Message::ShortDebugString_abi_cxx11_(&local_70,message);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                                        operator_delete(local_70._M_dataplus._M_p,
                                                        local_70.field_2._M_allocated_capacity + 1);
                                      }
                                      MessageLite::SerializeToString
                                                (&message->super_MessageLite,&local_138);
                                      Message::SpaceUsedLong(message);
                                      (*(message->super_MessageLite)._vptr_MessageLite[3])(message);
                                      iVar18 = MapKey::GetInt32Value(&local_1c0);
                                      local_150._M_len._0_4_ = iVar18;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                      ::try_emplace_impl<int>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)&local_208,(int *)&local_150);
                                      aVar14 = local_190;
                                      iVar18 = MapValueConstRef::GetInt32Value(&local_1a8);
                                      local_198._0_4_ = iVar18;
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetInt32Value()",
                                                 (int *)((long)aVar14.slot_ + 4),(int *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x58b,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                      local_13c = local_13c + 1;
                                    }
                                    local_198._0_4_ = 2;
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_1e0,"size","2",&local_13c,
                                               (int *)local_198);
                                    if (local_1e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_198);
                                      if (local_1d8.slot_ == (slot_type *)0x0) {
                                        sVar25 = (slot_type)0x3c762c;
                                      }
                                      else {
                                        sVar25.value = *(value_type *)local_1d8.slot_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)local_220,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                 ,0x58d,(char *)sVar25);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)local_220,(Message *)local_198);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)local_220);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_198 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (*(code *)(*(NodeBase **)local_198)[1].next)();
                                      }
                                    }
                                    if (local_1d8.slot_ != (slot_type *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_1e0 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1d8.slot_);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar2._8_8_ = 0;
                                    auVar2._0_8_ = local_190;
                                    _local_198 = (string_view)(auVar2 << 0x40);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    ::try_emplace_impl<long>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                *)&local_208,(long *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = (slot_type)0x0;
                                    local_198 = (undefined1  [8])0x1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    ::try_emplace_impl<long>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                *)&local_208,(long *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = (slot_type)0x1;
                                    name_18._M_str = "map_int64_int64";
                                    name_18._M_len = 0xf;
                                    pFVar20 = F(this,name_18);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_19._M_str = "map_int64_int64";
                                      name_19._M_len = 0xf;
                                      pFVar20 = F(this,name_19);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      sVar21 = MapKey::GetInt64Value(&local_1c0);
                                      local_150._M_len = sVar21;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                      ::try_emplace_impl<long>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)&local_208,(long *)&local_150);
                                      aVar14 = local_190;
                                      pcVar22 = (ctrl_t *)
                                                MapValueConstRef::GetInt64Value(&local_1a8);
                                      local_198 = (undefined1  [8])pcVar22;
                                      testing::internal::CmpHelperEQ<long,long>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetInt64Value()]",
                                                 "iter.GetValueRef().GetInt64Value()",
                                                 (long *)((long)aVar14.slot_ + 8),(long *)local_198)
                                      ;
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x596,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar3._12_4_ = 0;
                                    auVar3._0_12_ = stack0xfffffffffffffe6c;
                                    _local_198 = (string_view)(auVar3 << 0x20);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::try_emplace_impl<unsigned_int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                *)&local_208,(uint *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 0;
                                    local_198._0_4_ = 1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::try_emplace_impl<unsigned_int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                *)&local_208,(uint *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 1;
                                    name_20._M_str = "map_uint32_uint32";
                                    name_20._M_len = 0x11;
                                    pFVar20 = F(this,name_20);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_21._M_str = "map_uint32_uint32";
                                      name_21._M_len = 0x11;
                                      pFVar20 = F(this,name_21);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      uVar19 = MapKey::GetUInt32Value(&local_1c0);
                                      local_150._M_len._0_4_ = uVar19;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                      ::try_emplace_impl<unsigned_int>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)&local_208,(uint *)&local_150);
                                      aVar14 = local_190;
                                      uVar19 = MapValueConstRef::GetUInt32Value(&local_1a8);
                                      local_198._0_4_ = uVar19;
                                      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetUInt32Value()]",
                                                 "iter.GetValueRef().GetUInt32Value()",
                                                 (map_index_t *)((long)aVar14.slot_ + 4),
                                                 (uint *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5a1,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar4._8_8_ = 0;
                                    auVar4._0_8_ = local_190;
                                    _local_198 = (string_view)(auVar4 << 0x40);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    ::try_emplace_impl<unsigned_long>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                *)&local_208,(unsigned_long *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = (slot_type)0x0;
                                    local_198 = (undefined1  [8])0x1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    ::try_emplace_impl<unsigned_long>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                *)&local_208,(unsigned_long *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = (slot_type)0x1;
                                    name_22._M_str = "map_uint64_uint64";
                                    name_22._M_len = 0x11;
                                    pFVar20 = F(this,name_22);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_23._M_str = "map_uint64_uint64";
                                      name_23._M_len = 0x11;
                                      pFVar20 = F(this,name_23);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      uVar23 = MapKey::GetUInt64Value(&local_1c0);
                                      local_150._M_len = uVar23;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                      ::try_emplace_impl<unsigned_long>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)&local_208,&local_150._M_len);
                                      aVar14 = local_190;
                                      pcVar22 = (ctrl_t *)
                                                MapValueConstRef::GetUInt64Value(&local_1a8);
                                      local_198 = (undefined1  [8])pcVar22;
                                      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetUInt64Value()]",
                                                 "iter.GetValueRef().GetUInt64Value()",
                                                 (unsigned_long *)((long)aVar14.slot_ + 8),
                                                 (unsigned_long *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5ac,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar5._12_4_ = 0;
                                    auVar5._0_12_ = stack0xfffffffffffffe6c;
                                    _local_198 = (string_view)(auVar5 << 0x20);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 0;
                                    local_198._0_4_ = 1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 1;
                                    name_24._M_str = "map_sint32_sint32";
                                    name_24._M_len = 0x11;
                                    pFVar20 = F(this,name_24);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_25._M_str = "map_sint32_sint32";
                                      name_25._M_len = 0x11;
                                      pFVar20 = F(this,name_25);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      iVar18 = MapKey::GetInt32Value(&local_1c0);
                                      local_150._M_len._0_4_ = iVar18;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                      ::try_emplace_impl<int>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)&local_208,(int *)&local_150);
                                      aVar14 = local_190;
                                      iVar18 = MapValueConstRef::GetInt32Value(&local_1a8);
                                      local_198._0_4_ = iVar18;
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetInt32Value()",
                                                 (int *)((long)aVar14.slot_ + 4),(int *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5b7,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar6._8_8_ = 0;
                                    auVar6._0_8_ = local_190;
                                    _local_198 = (string_view)(auVar6 << 0x40);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    ::try_emplace_impl<long>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                *)&local_208,(long *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = (slot_type)0x0;
                                    local_198 = (undefined1  [8])0x1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    ::try_emplace_impl<long>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                *)&local_208,(long *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = (slot_type)0x1;
                                    name_26._M_str = "map_sint64_sint64";
                                    name_26._M_len = 0x11;
                                    pFVar20 = F(this,name_26);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_27._M_str = "map_sint64_sint64";
                                      name_27._M_len = 0x11;
                                      pFVar20 = F(this,name_27);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      sVar21 = MapKey::GetInt64Value(&local_1c0);
                                      local_150._M_len = sVar21;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                      ::try_emplace_impl<long>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)&local_208,(long *)&local_150);
                                      aVar14 = local_190;
                                      pcVar22 = (ctrl_t *)
                                                MapValueConstRef::GetInt64Value(&local_1a8);
                                      local_198 = (undefined1  [8])pcVar22;
                                      testing::internal::CmpHelperEQ<long,long>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetInt64Value()]",
                                                 "iter.GetValueRef().GetInt64Value()",
                                                 (long *)((long)aVar14.slot_ + 8),(long *)local_198)
                                      ;
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5c2,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar7._12_4_ = 0;
                                    auVar7._0_12_ = stack0xfffffffffffffe6c;
                                    _local_198 = (string_view)(auVar7 << 0x20);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::try_emplace_impl<unsigned_int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                *)&local_208,(uint *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 0;
                                    local_198._0_4_ = 1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::try_emplace_impl<unsigned_int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                *)&local_208,(uint *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 1;
                                    name_28._M_str = "map_fixed32_fixed32";
                                    name_28._M_len = 0x13;
                                    pFVar20 = F(this,name_28);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_29._M_str = "map_fixed32_fixed32";
                                      name_29._M_len = 0x13;
                                      pFVar20 = F(this,name_29);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      uVar19 = MapKey::GetUInt32Value(&local_1c0);
                                      local_150._M_len._0_4_ = uVar19;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                      ::try_emplace_impl<unsigned_int>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)&local_208,(uint *)&local_150);
                                      aVar14 = local_190;
                                      uVar19 = MapValueConstRef::GetUInt32Value(&local_1a8);
                                      local_198._0_4_ = uVar19;
                                      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetUInt32Value()]",
                                                 "iter.GetValueRef().GetUInt32Value()",
                                                 (map_index_t *)((long)aVar14.slot_ + 4),
                                                 (uint *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5ce,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar8._8_8_ = 0;
                                    auVar8._0_8_ = local_190;
                                    _local_198 = (string_view)(auVar8 << 0x40);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    ::try_emplace_impl<unsigned_long>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                *)&local_208,(unsigned_long *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = (slot_type)0x0;
                                    local_198 = (undefined1  [8])0x1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    ::try_emplace_impl<unsigned_long>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                *)&local_208,(unsigned_long *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = (slot_type)0x1;
                                    name_30._M_str = "map_fixed64_fixed64";
                                    name_30._M_len = 0x13;
                                    pFVar20 = F(this,name_30);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_31._M_str = "map_fixed64_fixed64";
                                      name_31._M_len = 0x13;
                                      pFVar20 = F(this,name_31);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      uVar23 = MapKey::GetUInt64Value(&local_1c0);
                                      local_150._M_len = uVar23;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                      ::try_emplace_impl<unsigned_long>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)&local_208,&local_150._M_len);
                                      aVar14 = local_190;
                                      pcVar22 = (ctrl_t *)
                                                MapValueConstRef::GetUInt64Value(&local_1a8);
                                      local_198 = (undefined1  [8])pcVar22;
                                      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetUInt64Value()]",
                                                 "iter.GetValueRef().GetUInt64Value()",
                                                 (unsigned_long *)((long)aVar14.slot_ + 8),
                                                 (unsigned_long *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5da,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar9._12_4_ = 0;
                                    auVar9._0_12_ = stack0xfffffffffffffe6c;
                                    _local_198 = (string_view)(auVar9 << 0x20);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 0;
                                    local_198._0_4_ = 1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 1;
                                    name_32._M_str = "map_sfixed32_sfixed32";
                                    name_32._M_len = 0x15;
                                    pFVar20 = F(this,name_32);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_33._M_str = "map_sfixed32_sfixed32";
                                      name_33._M_len = 0x15;
                                      pFVar20 = F(this,name_33);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      iVar18 = MapKey::GetInt32Value(&local_1c0);
                                      local_150._M_len._0_4_ = iVar18;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                      ::try_emplace_impl<int>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)&local_208,(int *)&local_150);
                                      aVar14 = local_190;
                                      iVar18 = MapValueConstRef::GetInt32Value(&local_1a8);
                                      local_198._0_4_ = iVar18;
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetInt32Value()",
                                                 (int *)((long)aVar14.slot_ + 4),(int *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5e6,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar10._12_4_ = 0;
                                    auVar10._0_12_ = stack0xfffffffffffffe6c;
                                    _local_198 = (string_view)(auVar10 << 0x20);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 0;
                                    local_198._0_4_ = 1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 0x3f800000;
                                    name_34._M_str = "map_int32_float";
                                    name_34._M_len = 0xf;
                                    pFVar20 = F(this,name_34);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_35._M_str = "map_int32_float";
                                      name_35._M_len = 0xf;
                                      pFVar20 = F(this,name_35);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      iVar18 = MapKey::GetInt32Value(&local_1c0);
                                      local_150._M_len._0_4_ = iVar18;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                      ::try_emplace_impl<int>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  *)&local_208,(int *)&local_150);
                                      aVar14 = local_190;
                                      fVar26 = MapValueConstRef::GetFloatValue(&local_1a8);
                                      local_198._0_4_ = fVar26;
                                      testing::internal::CmpHelperEQ<float,float>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetFloatValue()",
                                                 (float *)((long)aVar14.slot_ + 4),
                                                 (float *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5f0,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar11._12_4_ = 0;
                                    auVar11._0_12_ = stack0xfffffffffffffe6c;
                                    _local_198 = (string_view)(auVar11 << 0x20);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = (slot_type)0x0;
                                    local_198._0_4_ = 1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) =
                                         (slot_type)0x3ff0000000000000;
                                    name_36._M_str = "map_int32_double";
                                    name_36._M_len = 0x10;
                                    pFVar20 = F(this,name_36);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_37._M_str = "map_int32_double";
                                      name_37._M_len = 0x10;
                                      pFVar20 = F(this,name_37);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      iVar18 = MapKey::GetInt32Value(&local_1c0);
                                      local_150._M_len._0_4_ = iVar18;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                      ::try_emplace_impl<int>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  *)&local_208,(int *)&local_150);
                                      aVar14 = local_190;
                                      pcVar22 = (ctrl_t *)
                                                MapValueConstRef::GetDoubleValue(&local_1a8);
                                      local_198 = (undefined1  [8])pcVar22;
                                      testing::internal::CmpHelperEQ<double,double>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetDoubleValue()",
                                                 (double *)((long)aVar14.slot_ + 8),
                                                 (double *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5fb,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  *)&local_208);
                                    local_150._M_len._0_2_ = 0x100;
                                    name_38._M_str = "map_bool_bool";
                                    name_38._M_len = 0xd;
                                    pFVar20 = F(this,name_38);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_39._M_str = "map_bool_bool";
                                      name_39._M_len = 0xd;
                                      pFVar20 = F(this,name_39);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      bVar15 = MapKey::GetBoolValue(&local_1c0);
                                      bVar16 = MapValueConstRef::GetBoolValue(&local_1a8);
                                      local_208.settings_.
                                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                      .
                                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                      .value.capacity_ =
                                           CONCAT71(local_208.settings_.
                                                                                                        
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.capacity_._1_7_,bVar16);
                                      testing::internal::CmpHelperEQ<bool,bool>
                                                ((internal *)local_198,
                                                 "map[iter.GetKey().GetBoolValue() ? 1 : 0]",
                                                 "iter.GetValueRef().GetBoolValue()",
                                                 (bool *)((long)&local_150._M_len + (ulong)bVar15),
                                                 (bool *)&local_208);
                                      if (local_198[0] == (string)0x0) {
                                        testing::Message::Message((Message *)&local_208);
                                        pcVar24 = "";
                                        if (local_190.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_190.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)local_220,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x605,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)local_220,(Message *)&local_208);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)local_220);
                                        if ((long *)local_208.settings_.
                                                                                                        
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.capacity_ != (long *)0x0) {
                                          (**(code **)(*(long *)local_208.settings_.
                                                                                                                                
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.capacity_ + 8))();
                                        }
                                      }
                                      if (local_190.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_190,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_190.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 0;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    local_f8 = absl::lts_20250127::container_internal::kEmptyGroup +
                                               0x10;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.heap_or_soo_.heap.control =
                                         absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
                                    local_1e0 = (undefined1  [8])&local_1d0;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_1e0,
                                               "This is a very long string that goes in the heap",""
                                              );
                                    local_198 = (undefined1  [8])local_188;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_198,
                                               "This is a very long string that goes in the heap",""
                                              );
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                    ::try_emplace_impl<std::__cxx11::string>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                                                *)local_220,&local_208,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_198);
                                    std::__cxx11::string::operator=
                                              ((string *)((long)local_218.slot_ + 0x20),
                                               (string *)local_1e0);
                                    if (local_198 != (undefined1  [8])local_188) {
                                      operator_delete((void *)local_198,
                                                      local_188[0]._M_allocated_capacity + 1);
                                    }
                                    if (local_1e0 != (undefined1  [8])&local_1d0) {
                                      operator_delete((void *)local_1e0,
                                                      (ulong)((long)&(local_1d0.next)->next + 1));
                                    }
                                    local_1e0 = (undefined1  [8])&local_1d0;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_1e0,
                                               "This is another very long string that goes in the heap"
                                               ,"");
                                    local_198 = (undefined1  [8])local_188;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_198,
                                               "This is another very long string that goes in the heap"
                                               ,"");
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                    ::try_emplace_impl<std::__cxx11::string>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                                                *)local_220,&local_208,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_198);
                                    std::__cxx11::string::operator=
                                              ((string *)((long)local_218.slot_ + 0x20),
                                               (string *)local_1e0);
                                    if (local_198 != (undefined1  [8])local_188) {
                                      operator_delete((void *)local_198,
                                                      local_188[0]._M_allocated_capacity + 1);
                                    }
                                    if (local_1e0 != (undefined1  [8])&local_1d0) {
                                      operator_delete((void *)local_1e0,
                                                      (ulong)((long)&(local_1d0.next)->next + 1));
                                    }
                                    local_13c = 0;
                                    name_40._M_str = "map_string_string";
                                    name_40._M_len = 0x11;
                                    pFVar20 = F(this,name_40);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_41._M_str = "map_string_string";
                                      name_41._M_len = 0x11;
                                      pFVar20 = F(this,name_41);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      Message::DebugString_abi_cxx11_(&local_90,message);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_90._M_dataplus._M_p != &local_90.field_2) {
                                        operator_delete(local_90._M_dataplus._M_p,
                                                        local_90.field_2._M_allocated_capacity + 1);
                                      }
                                      Message::ShortDebugString_abi_cxx11_(&local_b0,message);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                                        operator_delete(local_b0._M_dataplus._M_p,
                                                        local_b0.field_2._M_allocated_capacity + 1);
                                      }
                                      MessageLite::SerializeToString
                                                (&message->super_MessageLite,&local_138);
                                      Message::SpaceUsedLong(message);
                                      (*(message->super_MessageLite)._vptr_MessageLite[3])(message);
                                      local_150 = MapKey::GetStringValue(&local_1c0);
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                      ::
                                      try_emplace_impl<std::basic_string_view<char,std::char_traits<char>>>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                                                  *)local_198,&local_208,&local_150);
                                      aVar14 = local_190;
                                      _local_198 = MapValueConstRef::GetStringValue(&local_1a8);
                                      testing::internal::
                                      CmpHelperEQ<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetStringValue()]",
                                                 "iter.GetValueRef().GetStringValue()",
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)aVar14.slot_ + 0x20),
                                                 (basic_string_view<char,_std::char_traits<char>_> *
                                                 )local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x618,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                      local_13c = local_13c + 1;
                                    }
                                    local_198._0_4_ = 2;
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_1e0,"size","2",&local_13c,
                                               (int *)local_198);
                                    if (local_1e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_198);
                                      if (local_1d8.slot_ == (slot_type *)0x0) {
                                        sVar25 = (slot_type)0x3c762c;
                                      }
                                      else {
                                        sVar25.value = *(value_type *)local_1d8.slot_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)local_220,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                 ,0x61a,(char *)sVar25);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)local_220,(Message *)local_198);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)local_220);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_198 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (*(code *)(*(NodeBase **)local_198)[1].next)();
                                      }
                                    }
                                    if (local_1d8.slot_ != (slot_type *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_1e0 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1d8.slot_);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::~raw_hash_set(&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 0;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.heap_or_soo_.heap.control = local_f8;
                                    local_1e0 = (undefined1  [8])&local_1d0;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_1e0,
                                               "This is a very long string that goes in the heap",""
                                              );
                                    local_220._0_4_ = 0;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                                                *)local_198,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)&local_208,(int *)local_220);
                                    std::__cxx11::string::operator=
                                              ((string *)((long)local_190.slot_ + 8),
                                               (string *)local_1e0);
                                    if (local_1e0 != (undefined1  [8])&local_1d0) {
                                      operator_delete((void *)local_1e0,
                                                      (ulong)((long)&(local_1d0.next)->next + 1));
                                    }
                                    local_1e0 = (undefined1  [8])&local_1d0;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_1e0,
                                               "This is another very long string that goes in the heap"
                                               ,"");
                                    local_220._0_4_ = 1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                                                *)local_198,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)&local_208,(int *)local_220);
                                    std::__cxx11::string::operator=
                                              ((string *)((long)local_190.slot_ + 8),
                                               (string *)local_1e0);
                                    if (local_1e0 != (undefined1  [8])&local_1d0) {
                                      operator_delete((void *)local_1e0,
                                                      (ulong)((long)&(local_1d0.next)->next + 1));
                                    }
                                    name_42._M_str = "map_int32_bytes";
                                    name_42._M_len = 0xf;
                                    pFVar20 = F(this,name_42);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_43._M_str = "map_int32_bytes";
                                      name_43._M_len = 0xf;
                                      pFVar20 = F(this,name_43);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      iVar18 = MapKey::GetInt32Value(&local_1c0);
                                      local_150._M_len._0_4_ = iVar18;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::try_emplace_impl<int>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&local_208,(int *)&local_150);
                                      aVar14 = local_190;
                                      _local_198 = MapValueConstRef::GetStringValue(&local_1a8);
                                      testing::internal::
                                      CmpHelperEQ<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetStringValue()",
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)aVar14.slot_ + 8),
                                                 (basic_string_view<char,_std::char_traits<char>_> *
                                                 )local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x623,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    sVar25 = (slot_type)this->map_enum_bar_;
                                    auVar12._12_4_ = 0;
                                    auVar12._0_12_ = stack0xfffffffffffffe6c;
                                    _local_198 = (string_view)(auVar12 << 0x20);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = sVar25;
                                    sVar25 = (slot_type)this->map_enum_baz_;
                                    local_198._0_4_ = 1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(slot_type *)((long)local_1d8.slot_ + 8) = sVar25;
                                    name_44._M_str = "map_int32_enum";
                                    name_44._M_len = 0xe;
                                    pFVar20 = F(this,name_44);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_45._M_str = "map_int32_enum";
                                      name_45._M_len = 0xe;
                                      pFVar20 = F(this,name_45);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      local_13c = MapKey::GetInt32Value(&local_1c0);
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                      ::try_emplace_impl<int>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  *)&local_208,&local_13c);
                                      local_150._M_len._0_4_ =
                                           *(undefined4 *)(*(long *)((long)local_190.slot_ + 8) + 4)
                                      ;
                                      iVar17 = MapValueConstRef::GetEnumValue(&local_1a8);
                                      local_198._0_4_ = iVar17;
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetInt32Value()]->number()",
                                                 "iter.GetValueRef().GetEnumValue()",
                                                 (int *)&local_150,(int *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x62d,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  *)&local_208);
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ = 1;
                                    local_208.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ = 0;
                                    auVar13._12_4_ = 0;
                                    auVar13._0_12_ = stack0xfffffffffffffe6c;
                                    _local_198 = (string_view)(auVar13 << 0x20);
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 0;
                                    local_198._0_4_ = 1;
                                    absl::lts_20250127::container_internal::
                                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::try_emplace_impl<int>
                                              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                *)local_1e0,
                                               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_208,(int *)local_198);
                                    *(undefined4 *)((long)local_1d8.slot_ + 4) = 1;
                                    local_13c = 0;
                                    name_46._M_str = "map_int32_foreign_message";
                                    name_46._M_len = 0x19;
                                    pFVar20 = F(this,name_46);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1e0,this_01,message,pFVar20);
                                    while( true ) {
                                      name_47._M_str = "map_int32_foreign_message";
                                      name_47._M_len = 0x19;
                                      pFVar20 = F(this,name_47);
                                      Reflection::MapEnd((MapIterator *)local_198,this_01,message,
                                                         pFVar20);
                                      bVar15 = internal::MapFieldBase::EqualIterator
                                                         (local_1c8,(MapIterator *)local_1e0,
                                                          (MapIterator *)local_198);
                                      if (bVar15) break;
                                      Message::DebugString_abi_cxx11_(&local_d0,message);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                                        operator_delete(local_d0._M_dataplus._M_p,
                                                        local_d0.field_2._M_allocated_capacity + 1);
                                      }
                                      Message::ShortDebugString_abi_cxx11_(&local_f0,message);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                                        operator_delete(local_f0._M_dataplus._M_p,
                                                        local_f0.field_2._M_allocated_capacity + 1);
                                      }
                                      MessageLite::SerializeToString
                                                (&message->super_MessageLite,&local_138);
                                      Message::SpaceUsedLong(message);
                                      (*(message->super_MessageLite)._vptr_MessageLite[3])(message);
                                      this_00 = MapValueConstRef::GetMessageValue(&local_1a8);
                                      iVar18 = MapKey::GetInt32Value(&local_1c0);
                                      local_150._M_len._0_4_ = iVar18;
                                      absl::lts_20250127::container_internal::
                                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                      ::try_emplace_impl<int>
                                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
                                                  *)local_198,
                                                 (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)&local_208,(int *)&local_150);
                                      aVar14 = local_190;
                                      MVar27 = Message::GetMetadata(this_00);
                                      iVar18 = Reflection::GetInt32
                                                         (MVar27.reflection,this_00,this->foreign_c_
                                                         );
                                      local_198._0_4_ = iVar18;
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)local_220,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "sub_message.GetReflection()->GetInt32(sub_message, foreign_c_)"
                                                 ,(int *)((long)aVar14.slot_ + 4),(int *)local_198);
                                      if (local_220[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_198);
                                        pcVar24 = "";
                                        if (local_218.slot_ != (slot_type *)0x0) {
                                          pcVar24 = *(char **)local_218.slot_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&local_150,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x641,pcVar24);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&local_150,(Message *)local_198);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&local_150);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_198 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (*(code *)(*(NodeBase **)local_198)[1].next)();
                                        }
                                      }
                                      if (local_218.slot_ != (slot_type *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_220 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218.slot_);
                                      }
                                      internal::MapFieldBase::IncreaseIterator
                                                (local_1c8,(MapIterator *)local_1e0);
                                      local_13c = local_13c + 1;
                                    }
                                    local_198._0_4_ = 2;
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_1e0,"size","2",&local_13c,
                                               (int *)local_198);
                                    if (local_1e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_198);
                                      if (local_1d8.slot_ == (slot_type *)0x0) {
                                        sVar25 = (slot_type)0x3c762c;
                                      }
                                      else {
                                        sVar25.value = *(value_type *)local_1d8.slot_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)local_220,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                 ,0x643,(char *)sVar25);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)local_220,(Message *)local_198);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)local_220);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_198 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (*(code *)(*(NodeBase **)local_198)[1].next)();
                                      }
                                    }
                                    if (local_1d8.slot_ != (slot_type *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_1e0 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1d8.slot_);
                                    }
                                    absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::~raw_hash_set((
                                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)&local_208);
                                    goto LAB_0019a3b4;
                                  }
                                  testing::Message::Message((Message *)local_198);
                                  if (local_1d8.slot_ == (slot_type *)0x0) {
                                    sVar25 = (slot_type)0x3c762c;
                                  }
                                  else {
                                    sVar25.value = *(value_type *)local_1d8.slot_;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&local_208,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                             ,0x57a,(char *)sVar25);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&local_208,(Message *)local_198);
                                }
                              }
                            }
                          }
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208)
                          ;
                          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                               )local_198 !=
                              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )0x0) {
                            (*(code *)(*(NodeBase **)local_198)[1].next)();
                          }
                          if (local_1d8.slot_ != (slot_type *)0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)(local_1e0 + 8),
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_1d8.slot_);
                          }
                          goto LAB_0019a3b4;
                        }
                        testing::Message::Message((Message *)local_198);
                        if (local_1d8.slot_ == (slot_type *)0x0) {
                          sVar25 = (slot_type)0x3c762c;
                        }
                        else {
                          sVar25.value = *(value_type *)local_1d8.slot_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_208,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                   ,0x575,(char *)sVar25);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_208,(Message *)local_198);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_198 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (*(code *)(*(NodeBase **)local_198)[1].next)();
  }
  if (local_1d8.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1e0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8.slot_);
  }
LAB_0019a3b4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  return;
}

Assistant:

void MapReflectionTester::ExpectMapFieldsSetViaReflectionIterator(
    Message* message) {
  std::string scratch;
  std::string serialized;
  const Reflection* reflection = message->GetReflection();

  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_int32")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int64_int64")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_uint32_uint32")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_uint64_uint64")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_sint32_sint32")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_sint64_sint64")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_fixed32_fixed32")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_fixed64_fixed64")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_sfixed32_sfixed32")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_sfixed64_sfixed64")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_float")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_double")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_bool_bool")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_string_string")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_bytes")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_enum")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_foreign_message")));

  {
    absl::flat_hash_map<int32_t, int32_t> map;
    map[0] = 0;
    map[1] = 1;
    int size = 0;
    for (MapIterator iter = reflection->MapBegin(message, F("map_int32_int32"));
         iter != reflection->MapEnd(message, F("map_int32_int32"));
         ++iter, ++size) {
      // Check const methods do not invalidate map.
      message->DebugString();
      message->ShortDebugString();
      message->SerializeToString(&serialized);
      message->SpaceUsedLong();
      message->ByteSizeLong();
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetInt32Value());
    }
    EXPECT_EQ(size, 2);
  }
  {
    absl::flat_hash_map<int64_t, int64_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter = reflection->MapBegin(message, F("map_int64_int64"));
         iter != reflection->MapEnd(message, F("map_int64_int64")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt64Value()],
                iter.GetValueRef().GetInt64Value());
    }
  }
  {
    absl::flat_hash_map<uint32_t, uint32_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_uint32_uint32"));
         iter != reflection->MapEnd(message, F("map_uint32_uint32")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetUInt32Value()],
                iter.GetValueRef().GetUInt32Value());
    }
  }
  {
    absl::flat_hash_map<uint64_t, uint64_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_uint64_uint64"));
         iter != reflection->MapEnd(message, F("map_uint64_uint64")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetUInt64Value()],
                iter.GetValueRef().GetUInt64Value());
    }
  }
  {
    absl::flat_hash_map<int32_t, int32_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_sint32_sint32"));
         iter != reflection->MapEnd(message, F("map_sint32_sint32")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetInt32Value());
    }
  }
  {
    absl::flat_hash_map<int64_t, int64_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_sint64_sint64"));
         iter != reflection->MapEnd(message, F("map_sint64_sint64")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt64Value()],
                iter.GetValueRef().GetInt64Value());
    }
  }
  {
    absl::flat_hash_map<uint32_t, uint32_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_fixed32_fixed32"));
         iter != reflection->MapEnd(message, F("map_fixed32_fixed32"));
         ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetUInt32Value()],
                iter.GetValueRef().GetUInt32Value());
    }
  }
  {
    absl::flat_hash_map<uint64_t, uint64_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_fixed64_fixed64"));
         iter != reflection->MapEnd(message, F("map_fixed64_fixed64"));
         ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetUInt64Value()],
                iter.GetValueRef().GetUInt64Value());
    }
  }
  {
    absl::flat_hash_map<int32_t, int32_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_sfixed32_sfixed32"));
         iter != reflection->MapEnd(message, F("map_sfixed32_sfixed32"));
         ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetInt32Value());
    }
  }
  {
    absl::flat_hash_map<int32_t, float> map;
    map[0] = 0.0;
    map[1] = 1.0;
    for (MapIterator iter = reflection->MapBegin(message, F("map_int32_float"));
         iter != reflection->MapEnd(message, F("map_int32_float")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetFloatValue());
    }
  }
  {
    absl::flat_hash_map<int32_t, double> map;
    map[0] = 0.0;
    map[1] = 1.0;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_int32_double"));
         iter != reflection->MapEnd(message, F("map_int32_double")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetDoubleValue());
    }
  }
  {
    std::array<bool, 2> map;
    map[0] = false;
    map[1] = true;
    for (MapIterator iter = reflection->MapBegin(message, F("map_bool_bool"));
         iter != reflection->MapEnd(message, F("map_bool_bool")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetBoolValue() ? 1 : 0],
                iter.GetValueRef().GetBoolValue());
    }
  }
  {
    absl::flat_hash_map<std::string, std::string> map;
    map[long_string()] = long_string();
    map[long_string_2()] = long_string_2();
    int size = 0;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_string_string"));
         iter != reflection->MapEnd(message, F("map_string_string"));
         ++iter, ++size) {
      // Check const methods do not invalidate map.
      message->DebugString();
      message->ShortDebugString();
      message->SerializeToString(&serialized);
      message->SpaceUsedLong();
      message->ByteSizeLong();
      EXPECT_EQ(map[iter.GetKey().GetStringValue()],
                iter.GetValueRef().GetStringValue());
    }
    EXPECT_EQ(size, 2);
  }
  {
    absl::flat_hash_map<int32_t, std::string> map;
    map[0] = long_string();
    map[1] = long_string_2();
    for (MapIterator iter = reflection->MapBegin(message, F("map_int32_bytes"));
         iter != reflection->MapEnd(message, F("map_int32_bytes")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetStringValue());
    }
  }
  {
    absl::flat_hash_map<int32_t, const EnumValueDescriptor*> map;
    map[0] = map_enum_bar_;
    map[1] = map_enum_baz_;
    for (MapIterator iter = reflection->MapBegin(message, F("map_int32_enum"));
         iter != reflection->MapEnd(message, F("map_int32_enum")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()]->number(),
                iter.GetValueRef().GetEnumValue());
    }
  }
  {
    absl::flat_hash_map<int32_t, int32_t> map;
    map[0] = 0;
    map[1] = 1;
    int size = 0;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_int32_foreign_message"));
         iter != reflection->MapEnd(message, F("map_int32_foreign_message"));
         ++iter, ++size) {
      // Check const methods do not invalidate map.
      message->DebugString();
      message->ShortDebugString();
      message->SerializeToString(&serialized);
      message->SpaceUsedLong();
      message->ByteSizeLong();
      const Message& sub_message = iter.GetValueRef().GetMessageValue();
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                sub_message.GetReflection()->GetInt32(sub_message, foreign_c_));
    }
    EXPECT_EQ(size, 2);
  }
}